

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writeObj(MakefileGenerator *this,QTextStream *t,char *src)

{
  long lVar1;
  QMakeProject *pQVar2;
  char16_t *pcVar3;
  bool bVar4;
  int iVar5;
  ProStringList *sources;
  QString *pQVar6;
  QString *pQVar7;
  QTextStream *pQVar8;
  undefined4 extraout_var;
  QList<ProString> *pQVar9;
  iterator other;
  iterator iVar10;
  iterator sub;
  iterator iVar11;
  ProString *this_00;
  ProString *this_01;
  ProString *pPVar12;
  long in_FS_OFFSET;
  ProString local_178;
  ProString compilerSuffix;
  ProString extensionSuffix;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<ProString> local_88;
  ProKey comp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->project;
  ProKey::ProKey(&comp,src);
  sources = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,&comp);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&comp);
  local_88.size = -0x5555555555555556;
  local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  createObjectList((ProStringList *)&local_88,this,sources);
  this_00 = local_88.ptr;
  this_01 = (sources->super_QList<ProString>).d.ptr;
  pQVar6 = (QString *)QtPrivate::lengthHelperPointer<char>("$src");
  pQVar7 = (QString *)QtPrivate::lengthHelperPointer<char>("$obj");
  pPVar12 = this_01;
  do {
    if ((this_01 == pPVar12 + (sources->super_QList<ProString>).d.size) ||
       (this_00 == local_88.ptr + local_88.size)) {
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    if (this_01->m_length != 0) {
      local_a8.size = -0x5555555555555556;
      local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_a8,this_01);
      local_c8.size = -0x5555555555555556;
      local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)&local_c8,this_00);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                (&comp.super_ProString,this,&local_c8);
      pQVar8 = (QTextStream *)QTextStream::operator<<(t,(QString *)&comp.super_ProString);
      pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,": ");
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                (&extensionSuffix,this,&local_a8);
      pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&extensionSuffix);
      pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," ");
      iVar5 = (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x10])(this,&local_a8);
      finalizeDependencyPaths
                ((QStringList *)&local_178,this,(QStringList *)CONCAT44(extraout_var,iVar5));
      QString::QString((QString *)&local_e0," \\\n\t\t");
      QListSpecialMethods<QString>::join
                (&compilerSuffix.m_string,(QListSpecialMethods<QString> *)&local_178,
                 (QString *)&local_e0);
      QTextStream::operator<<(pQVar8,(QString *)&compilerSuffix);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&compilerSuffix);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&comp.super_ProString);
      comp.super_ProString.m_file = -0x55555556;
      comp.super_ProString._36_4_ = 0xaaaaaaaa;
      comp.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      comp.super_ProString.m_string.d.size = -0x5555555555555556;
      comp.super_ProString.m_offset = -0x55555556;
      comp.super_ProString.m_length = -0x55555556;
      comp.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      comp.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::ProString(&comp.super_ProString);
      pQVar2 = this->project;
      ProKey::ProKey((ProKey *)&extensionSuffix,"QMAKE_BUILTIN_COMPILERS");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix)
                ->super_QList<ProString>;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      other = QList<ProString>::begin(pQVar9);
      iVar10 = QList<ProString>::end(pQVar9);
      do {
        if (other.i == iVar10.i) break;
        extensionSuffix.m_file = -0x55555556;
        extensionSuffix._36_4_ = 0xaaaaaaaa;
        extensionSuffix.m_hash = 0xaaaaaaaaaaaaaaaa;
        extensionSuffix.m_string.d.size = -0x5555555555555556;
        extensionSuffix.m_offset = -0x55555556;
        extensionSuffix.m_length = -0x55555556;
        extensionSuffix.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        extensionSuffix.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::ProString(&extensionSuffix,other.i);
        bVar4 = ProString::operator==(&extensionSuffix,"CXX");
        if (bVar4) {
          ProString::ProString(&compilerSuffix,"CPP");
          ProString::operator=(&extensionSuffix,&compilerSuffix);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerSuffix);
        }
        compilerSuffix.m_file = -0x55555556;
        compilerSuffix._36_4_ = 0xaaaaaaaa;
        compilerSuffix.m_hash = 0xaaaaaaaaaaaaaaaa;
        compilerSuffix.m_string.d.size = -0x5555555555555556;
        compilerSuffix.m_offset = -0x55555556;
        compilerSuffix.m_length = -0x55555556;
        compilerSuffix.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        compilerSuffix.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::ProString(&compilerSuffix,other.i);
        bVar4 = ProString::operator==(&compilerSuffix,"C");
        if (bVar4) {
          ProString::ProString(&local_178,"CC");
          ProString::operator=(&compilerSuffix,&local_178);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178)
          ;
        }
        pQVar2 = this->project;
        local_e0.d = (Data *)0x21a9b6;
        local_e0.ptr = (char16_t *)&extensionSuffix;
        ProString::ProString<char_const(&)[11],ProString&>
                  (&local_178,(QStringBuilder<const_char_(&)[11],_ProString_&> *)&local_e0);
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_178)->
                  super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
        sub = QList<ProString>::begin(pQVar9);
        iVar11 = QList<ProString>::end(pQVar9);
        do {
          if (sub.i == iVar11.i) goto LAB_001485c1;
          bVar4 = ProString::endsWith(this_01,sub.i,CaseSensitive);
          sub.i = sub.i + 1;
        } while (!bVar4);
        local_e0.d = (Data *)0x21a9c1;
        local_e0.ptr = (char16_t *)&compilerSuffix;
        ProString::ProString<char_const(&)[11],ProString&>
                  (&local_178,(QStringBuilder<const_char_(&)[11],_ProString_&> *)&local_e0);
        ProString::operator=(&comp.super_ProString,&local_178);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
LAB_001485c1:
        pcVar3 = comp.super_ProString.m_string.d.ptr;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerSuffix);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&extensionSuffix);
        other.i = other.i + 1;
      } while (pcVar3 == (char16_t *)0x0);
      if (comp.super_ProString.m_length == 0) {
        ProKey::ProKey((ProKey *)&extensionSuffix,"QMAKE_RUN_CC");
        ProString::operator=(&comp.super_ProString,&extensionSuffix);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      }
      bVar4 = QMakeProject::isEmpty(this->project,(ProKey *)&comp.super_ProString);
      if (!bVar4) {
        extensionSuffix.m_string.d.size = -0x5555555555555556;
        extensionSuffix.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        extensionSuffix.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                  (&extensionSuffix,this,&comp.super_ProString);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (&compilerSuffix,this,&local_a8);
        QString::replace((QLatin1String *)&extensionSuffix,pQVar6,0x21c3ba);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerSuffix);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (&compilerSuffix,this,&local_c8);
        QString::replace((QLatin1String *)&extensionSuffix,pQVar7,0x21a9ab);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerSuffix);
        pQVar8 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
        QTextStream::operator<<(pQVar8,(QString *)&extensionSuffix);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      }
      pQVar8 = (QTextStream *)Qt::endl(t);
      Qt::endl(pQVar8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&comp);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      pPVar12 = (sources->super_QList<ProString>).d.ptr;
    }
    this_00 = this_00 + 1;
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void
MakefileGenerator::writeObj(QTextStream &t, const char *src)
{
    const ProStringList &srcl = project->values(src);
    const ProStringList objl = createObjectList(srcl);

    ProStringList::ConstIterator oit = objl.begin();
    ProStringList::ConstIterator sit = srcl.begin();
    QLatin1String stringSrc("$src");
    QLatin1String stringObj("$obj");
    for(;sit != srcl.end() && oit != objl.end(); ++oit, ++sit) {
        if((*sit).isEmpty())
            continue;

        QString srcf = (*sit).toQString();
        QString dstf = (*oit).toQString();
        t << escapeDependencyPath(dstf) << ": " << escapeDependencyPath(srcf)
          << " " << finalizeDependencyPaths(findDependencies(srcf)).join(" \\\n\t\t");

        ProKey comp;
        for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
            // Unfortunately we were not consistent about the C++ naming
            ProString extensionSuffix = compiler;
            if (extensionSuffix == "CXX")
                extensionSuffix = ProString("CPP");

            // Nor the C naming
            ProString compilerSuffix = compiler;
            if (compilerSuffix == "C")
                compilerSuffix = ProString("CC");

            for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                if ((*sit).endsWith(extension)) {
                    comp = ProKey("QMAKE_RUN_" + compilerSuffix);
                    break;
                }
            }

            if (!comp.isNull())
                break;
        }

        if (comp.isEmpty())
            comp = "QMAKE_RUN_CC";
        if (!project->isEmpty(comp)) {
            QString p = var(comp);
            p.replace(stringSrc, escapeFilePath(srcf));
            p.replace(stringObj, escapeFilePath(dstf));
            t << "\n\t" << p;
        }
        t << Qt::endl << Qt::endl;
    }
}